

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accounts.cpp
# Opt level: O2

void __thiscall Accounts::AddCharacter(Accounts *this,string *username,string *character_name)

{
  Account account;
  string local_c0;
  Account local_a0;
  Account local_58;
  
  GetAccount(&local_a0,this,username);
  std::__cxx11::string::string((string *)&local_c0,(string *)character_name);
  Account::AddCharacter(&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  Account::Account(&local_58,&local_a0);
  AddAccount(this,&local_58);
  Account::~Account(&local_58);
  Account::~Account(&local_a0);
  return;
}

Assistant:

void Accounts::AddCharacter(std::string username, std::string character_name) {
    Account account = GetAccount(username);
    account.AddCharacter(character_name);
    AddAccount(account);
}